

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

int forward_dns_request(sockaddr *dest_addr,socklen_t dest_len,void *data,size_t len)

{
  int __fd;
  int iVar1;
  size_t sVar2;
  int fd;
  int rc;
  ssize_t outgoing;
  size_t len_local;
  void *data_local;
  socklen_t dest_len_local;
  sockaddr *dest_addr_local;
  
  __fd = socket((uint)dest_addr->sa_family,2,0x11);
  if (__fd == -1) {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x210,
               "forward_dns_request",1,3,"socket");
  }
  else {
    iVar1 = evutil_make_socket_nonblocking(__fd);
    if (iVar1 == 0) {
      sVar2 = sendto(__fd,data,len,0,(sockaddr *)dest_addr,dest_len);
      if (sVar2 == 0xffffffffffffffff) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x21c,"forward_dns_request",1,7,"sendto: Can\'t forward packet");
      }
      else {
        if (sVar2 == len) {
          return __fd;
        }
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x220,"forward_dns_request",0,7,
                   "sendto: I was sending %zd bytes, but only %zd were sent.",len,sVar2);
      }
    }
    else {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x216
                 ,"forward_dns_request",1,3,"evutil_make_socket_nonblocking");
    }
  }
  if (-1 < __fd) {
    evutil_closesocket(__fd);
  }
  return -1;
}

Assistant:

static int forward_dns_request(struct sockaddr * dest_addr, socklen_t dest_len, const void *data, size_t len)
{
    ssize_t outgoing;
    int rc;
    int fd = -1;

    fd = socket(dest_addr->sa_family, SOCK_DGRAM, IPPROTO_UDP);
    if (fd == -1) {
        log_errno(LOG_ERR, "socket");
        goto fail;
    }

    rc = evutil_make_socket_nonblocking(fd);
    if (rc) {
        log_errno(LOG_ERR, "evutil_make_socket_nonblocking");
        goto fail;
    }

    outgoing = sendto(fd, data, len, 0, dest_addr, dest_len);
    if (outgoing == -1) {
        log_errno(LOG_DEBUG, "sendto: Can't forward packet");
        goto fail;
    }
    else if (outgoing != len) {
        log_error(LOG_DEBUG, "sendto: I was sending %zd bytes, but only %zd were sent.", len, outgoing);
        goto fail;
    }
    return fd;
fail:
    if (fd >= 0) {
        evutil_closesocket(fd);
    }
    return -1;
}